

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f * __thiscall
Matrix4f::inverse(Matrix4f *__return_storage_ptr__,Matrix4f *this,bool *pbIsSingular,float epsilon)

{
  float m22;
  float m00;
  float m10;
  float m01;
  float m11;
  float m12;
  float m02;
  float m12_00;
  float m20;
  float m21;
  float m22_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  uint extraout_XMM0_Dc_03;
  uint extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  uint extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  uint extraout_XMM0_Dd_03;
  uint extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  uint extraout_XMM0_Dd_06;
  undefined1 extraout_var [60];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  m22 = this->m_elements[0];
  m00 = this->m_elements[5];
  m10 = this->m_elements[6];
  fVar26 = this->m_elements[7];
  m01 = this->m_elements[9];
  m11 = this->m_elements[10];
  fVar27 = this->m_elements[0xb];
  fVar29 = this->m_elements[0xd];
  m12 = this->m_elements[0xe];
  m02 = this->m_elements[1];
  m12_00 = this->m_elements[2];
  fVar28 = this->m_elements[3];
  m20 = this->m_elements[4];
  m21 = this->m_elements[8];
  m22_00 = this->m_elements[0xc];
  fVar25 = this->m_elements[0xf];
  fVar15 = Matrix3f::determinant3x3(m00,m01,fVar29,m10,m11,m12,fVar26,fVar27,fVar25);
  fVar16 = Matrix3f::determinant3x3(m01,fVar29,m02,m11,m12,m12_00,fVar27,fVar25,fVar28);
  fVar17 = Matrix3f::determinant3x3(fVar29,m02,m00,m12,m12_00,m10,fVar25,fVar28,fVar26);
  fVar18 = Matrix3f::determinant3x3(m02,m00,m01,m12_00,m10,m11,fVar28,fVar26,fVar27);
  fVar19 = Matrix3f::determinant3x3(m10,m11,m12,fVar26,fVar27,fVar25,m20,m21,m22_00);
  fVar20 = Matrix3f::determinant3x3(m11,m12,m12_00,fVar27,fVar25,fVar28,m21,m22_00,m22);
  fVar21 = Matrix3f::determinant3x3(m12,m12_00,m10,fVar25,fVar28,fVar26,m22_00,m22,m20);
  fVar22 = Matrix3f::determinant3x3(m12_00,m10,m11,fVar28,fVar26,fVar27,m22,m20,m21);
  fVar23 = Matrix3f::determinant3x3(fVar26,fVar27,fVar25,m20,m21,m22_00,m00,m01,fVar29);
  fVar24 = Matrix3f::determinant3x3(fVar27,fVar25,fVar28,m21,m22_00,m22,m01,fVar29,m02);
  fVar25 = Matrix3f::determinant3x3(fVar25,fVar28,fVar26,m22_00,m22,m20,fVar29,m02,m00);
  fVar26 = Matrix3f::determinant3x3(fVar28,fVar26,fVar27,m22,m20,m21,m02,m00,m01);
  fVar27 = Matrix3f::determinant3x3(m20,m21,m22_00,m00,m01,fVar29,m10,m11,m12);
  fVar28 = Matrix3f::determinant3x3(m21,m22_00,m22,m01,fVar29,m02,m11,m12,m12_00);
  fVar29 = Matrix3f::determinant3x3(m22_00,m22,m20,fVar29,m02,m00,m12,m12_00,m10);
  auVar14._0_4_ = Matrix3f::determinant3x3(m22,m20,m21,m02,m00,m01,m12_00,m10,m11);
  auVar14._4_60_ = extraout_var;
  auVar5._4_4_ = extraout_XMM0_Db;
  auVar5._0_4_ = fVar15;
  auVar5._8_4_ = extraout_XMM0_Dc;
  auVar5._12_4_ = extraout_XMM0_Dd;
  auVar4._4_4_ = extraout_XMM0_Db_01;
  auVar4._0_4_ = fVar17;
  auVar4._8_4_ = extraout_XMM0_Dc_01;
  auVar4._12_4_ = extraout_XMM0_Dd_01;
  auVar1._4_4_ = extraout_XMM0_Db_02;
  auVar1._0_4_ = fVar18;
  auVar1._8_4_ = extraout_XMM0_Dc_02;
  auVar1._12_4_ = extraout_XMM0_Dd_02;
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * m20)),auVar5,ZEXT416((uint)m22));
  auVar2 = vfmadd231ss_fma(auVar2,auVar4,ZEXT416((uint)m21));
  auVar2 = vfnmadd231ss_fma(auVar2,auVar1,ZEXT416((uint)m22_00));
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx512vl(auVar2,auVar6);
  if (epsilon <= auVar6._0_4_) {
    auVar6 = vinsertps_avx(auVar1,ZEXT416((uint)fVar19),0x10);
    auVar3._4_4_ = extraout_XMM0_Db_05;
    auVar3._0_4_ = fVar26;
    auVar3._8_4_ = extraout_XMM0_Dc_05;
    auVar3._12_4_ = extraout_XMM0_Dd_05;
    auVar32._0_8_ = CONCAT44(extraout_XMM0_Db_03,fVar21) ^ 0x8000000080000000;
    auVar32._8_4_ = extraout_XMM0_Dc_03 ^ 0x80000000;
    auVar32._12_4_ = extraout_XMM0_Dd_03 ^ 0x80000000;
    auVar33._0_8_ = CONCAT44(extraout_XMM0_Db_00,fVar16) ^ 0x8000000080000000;
    auVar33._8_4_ = extraout_XMM0_Dc_00 ^ 0x80000000;
    auVar33._12_4_ = extraout_XMM0_Dd_00 ^ 0x80000000;
    auVar35._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
    auVar35._8_4_ = auVar6._8_4_ ^ 0x80000000;
    auVar35._12_4_ = auVar6._12_4_ ^ 0x80000000;
    auVar31._0_8_ = CONCAT44(extraout_XMM0_Db_04,fVar24) ^ 0x8000000080000000;
    auVar31._8_4_ = extraout_XMM0_Dc_04 ^ 0x80000000;
    auVar31._12_4_ = extraout_XMM0_Dd_04 ^ 0x80000000;
    auVar6 = vinsertps_avx(auVar3,ZEXT416((uint)fVar27),0x10);
    auVar30._0_8_ = CONCAT44(extraout_XMM0_Db_06,fVar29) ^ 0x8000000080000000;
    auVar30._8_4_ = extraout_XMM0_Dc_06 ^ 0x80000000;
    auVar30._12_4_ = extraout_XMM0_Dd_06 ^ 0x80000000;
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = false;
    }
    auVar36._0_4_ = 1.0 / auVar2._0_4_;
    auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar2 = vinsertps_avx(auVar5,auVar33,0x10);
    auVar1 = vshufps_avx(auVar35,auVar35,0xe1);
    auVar34._0_8_ = auVar1._0_8_;
    auVar34._8_8_ = auVar34._0_8_;
    auVar34._16_8_ = auVar34._0_8_;
    auVar34._24_8_ = auVar34._0_8_;
    auVar2 = vinsertps_avx(auVar2,auVar4,0x20);
    auVar34 = vblendps_avx(ZEXT1632(auVar2),auVar34,0xf8);
    auVar7 = vbroadcastss_avx512f(ZEXT416((uint)fVar20));
    auVar8 = vbroadcastss_avx512f(auVar32);
    auVar9 = vbroadcastss_avx512f(ZEXT416((uint)fVar22));
    auVar10 = vbroadcastss_avx512f(ZEXT416((uint)fVar23));
    auVar11 = vbroadcastss_avx512f(auVar31);
    auVar12 = vbroadcastss_avx512f(ZEXT416((uint)fVar25));
    auVar13 = vxorps_avx512dq(ZEXT1664(auVar6),
                              ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      ));
    auVar7 = vpermi2ps_avx512f(_DAT_001d4b40,
                               ZEXT4464(CONCAT440(auVar12._40_4_,
                                                  CONCAT436(auVar11._36_4_,
                                                            CONCAT432(auVar10._32_4_,
                                                                      CONCAT428(auVar9._28_4_,
                                                                                CONCAT424(auVar8.
                                                  _24_4_,CONCAT420(auVar7._20_4_,auVar34._0_20_)))))
                                                 )),auVar13);
    auVar8 = vbroadcastss_avx512f(ZEXT416((uint)fVar28));
    auVar9._52_4_ = auVar8._52_4_;
    auVar8 = vbroadcastss_avx512f(auVar30);
    auVar9._56_4_ = auVar8._56_4_;
    auVar8 = vbroadcastss_avx512f(auVar36);
    auVar14 = vbroadcastss_avx512f(auVar14._0_16_);
    auVar9._0_52_ = auVar7._0_52_;
    auVar9._60_4_ = auVar14._60_4_;
    auVar14 = vmulps_avx512f(auVar9,auVar8);
    *(undefined1 (*) [64])__return_storage_ptr__->m_elements = auVar14;
  }
  else {
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = true;
    }
    *(undefined1 (*) [64])__return_storage_ptr__->m_elements = ZEXT1264(ZEXT412(0));
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::inverse( bool* pbIsSingular, float epsilon ) const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];
	float m30 = m_elements[ 3 ];

	float m01 = m_elements[ 4 ];
	float m11 = m_elements[ 5 ];
	float m21 = m_elements[ 6 ];
	float m31 = m_elements[ 7 ];

	float m02 = m_elements[ 8 ];
	float m12 = m_elements[ 9 ];
	float m22 = m_elements[ 10 ];
	float m32 = m_elements[ 11 ];

	float m03 = m_elements[ 12 ];
	float m13 = m_elements[ 13 ];
	float m23 = m_elements[ 14 ];
	float m33 = m_elements[ 15 ];

    float cofactor00 =  Matrix3f::determinant3x3( m11, m12, m13, m21, m22, m23, m31, m32, m33 );
    float cofactor01 = -Matrix3f::determinant3x3( m12, m13, m10, m22, m23, m20, m32, m33, m30 );
    float cofactor02 =  Matrix3f::determinant3x3( m13, m10, m11, m23, m20, m21, m33, m30, m31 );
    float cofactor03 = -Matrix3f::determinant3x3( m10, m11, m12, m20, m21, m22, m30, m31, m32 );
    
    float cofactor10 = -Matrix3f::determinant3x3( m21, m22, m23, m31, m32, m33, m01, m02, m03 );
    float cofactor11 =  Matrix3f::determinant3x3( m22, m23, m20, m32, m33, m30, m02, m03, m00 );
    float cofactor12 = -Matrix3f::determinant3x3( m23, m20, m21, m33, m30, m31, m03, m00, m01 );
    float cofactor13 =  Matrix3f::determinant3x3( m20, m21, m22, m30, m31, m32, m00, m01, m02 );
    
    float cofactor20 =  Matrix3f::determinant3x3( m31, m32, m33, m01, m02, m03, m11, m12, m13 );
    float cofactor21 = -Matrix3f::determinant3x3( m32, m33, m30, m02, m03, m00, m12, m13, m10 );
    float cofactor22 =  Matrix3f::determinant3x3( m33, m30, m31, m03, m00, m01, m13, m10, m11 );
    float cofactor23 = -Matrix3f::determinant3x3( m30, m31, m32, m00, m01, m02, m10, m11, m12 );
    
    float cofactor30 = -Matrix3f::determinant3x3( m01, m02, m03, m11, m12, m13, m21, m22, m23 );
    float cofactor31 =  Matrix3f::determinant3x3( m02, m03, m00, m12, m13, m10, m22, m23, m20 );
    float cofactor32 = -Matrix3f::determinant3x3( m03, m00, m01, m13, m10, m11, m23, m20, m21 );
    float cofactor33 =  Matrix3f::determinant3x3( m00, m01, m02, m10, m11, m12, m20, m21, m22 );

	float determinant = m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02 + m03 * cofactor03;

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix4f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix4f
			(
				cofactor00 * reciprocalDeterminant, cofactor10 * reciprocalDeterminant, cofactor20 * reciprocalDeterminant, cofactor30 * reciprocalDeterminant,
				cofactor01 * reciprocalDeterminant, cofactor11 * reciprocalDeterminant, cofactor21 * reciprocalDeterminant, cofactor31 * reciprocalDeterminant,
				cofactor02 * reciprocalDeterminant, cofactor12 * reciprocalDeterminant, cofactor22 * reciprocalDeterminant, cofactor32 * reciprocalDeterminant,
				cofactor03 * reciprocalDeterminant, cofactor13 * reciprocalDeterminant, cofactor23 * reciprocalDeterminant, cofactor33 * reciprocalDeterminant
			);
	}
}